

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O2

void GEN_CS::gen_cs_example_ips(cb_to_cs *c,label *ld,label *cs_ld)

{
  float fVar1;
  cb_class *pcVar2;
  cb_class *pcVar3;
  long lVar4;
  ulong uVar5;
  uint32_t i;
  uint uVar6;
  cb_class *__begin2;
  cb_class *pcVar7;
  cb_class *__end2;
  wclass local_40;
  
  v_array<COST_SENSITIVE::wclass>::clear(&cs_ld->costs);
  pcVar7 = (ld->costs)._begin;
  pcVar2 = (ld->costs)._end;
  lVar4 = (long)pcVar2 - (long)pcVar7 >> 4;
  if ((lVar4 == 0) || ((lVar4 == 1 && ((pcVar7->cost != 3.4028235e+38 || (NAN(pcVar7->cost))))))) {
    for (uVar6 = 1; uVar6 <= c->num_actions; uVar6 = uVar6 + 1) {
      local_40.x = 0.0;
      local_40.partial_prediction = 0.0;
      local_40.wap_value = 0.0;
      pcVar7 = c->known_cost;
      local_40.class_index = uVar6;
      if ((pcVar7 != (cb_class *)0x0) && (uVar6 == pcVar7->action)) {
        fVar1 = pcVar7->cost;
        local_40.x = safe_probability(pcVar7->probability);
        local_40.x = fVar1 / local_40.x;
        uVar5 = c->nb_ex_regressors + 1;
        c->nb_ex_regressors = uVar5;
        fVar1 = c->known_cost->cost;
        c->avg_loss_regressors =
             (fVar1 * fVar1 - c->avg_loss_regressors) * (1.0 / (float)uVar5) +
             c->avg_loss_regressors;
        c->last_pred_reg = 0.0;
        c->last_correct_cost = c->known_cost->cost;
      }
      v_array<COST_SENSITIVE::wclass>::push_back(&cs_ld->costs,&local_40);
    }
  }
  else {
    for (; pcVar7 != pcVar2; pcVar7 = pcVar7 + 1) {
      local_40.x = 0.0;
      local_40.class_index = pcVar7->action;
      local_40.partial_prediction = 0.0;
      local_40.wap_value = 0.0;
      pcVar3 = c->known_cost;
      if ((pcVar3 != (cb_class *)0x0) && (local_40.class_index == pcVar3->action)) {
        fVar1 = pcVar3->cost;
        local_40.x = safe_probability(pcVar3->probability);
        local_40.x = fVar1 / local_40.x;
        uVar5 = c->nb_ex_regressors + 1;
        c->nb_ex_regressors = uVar5;
        fVar1 = c->known_cost->cost;
        c->avg_loss_regressors =
             (fVar1 * fVar1 - c->avg_loss_regressors) * (1.0 / (float)uVar5) +
             c->avg_loss_regressors;
        c->last_pred_reg = 0.0;
        c->last_correct_cost = c->known_cost->cost;
      }
      v_array<COST_SENSITIVE::wclass>::push_back(&cs_ld->costs,&local_40);
    }
  }
  return;
}

Assistant:

void gen_cs_example_ips(cb_to_cs& c, CB::label& ld, COST_SENSITIVE::label& cs_ld)
{
  // this implements the inverse propensity score method, where cost are importance weighted by the probability of the
  // chosen action generate cost-sensitive example
  cs_ld.costs.clear();
  if (ld.costs.size() == 0 || (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX))
  // this is a typical example where we can perform all actions
  {
    // in this case generate cost-sensitive example with all actions
    for (uint32_t i = 1; i <= c.num_actions; i++)
    {
      COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
      if (c.known_cost != nullptr && i == c.known_cost->action)
      {
        wc.x = c.known_cost->cost /
            safe_probability(
                c.known_cost->probability);  // use importance weighted cost for observed action, 0 otherwise
        // ips can be thought as the doubly robust method with a fixed regressor that predicts 0 costs for everything
        // update the loss of this regressor
        c.nb_ex_regressors++;
        c.avg_loss_regressors +=
            (1.0f / c.nb_ex_regressors) * ((c.known_cost->cost) * (c.known_cost->cost) - c.avg_loss_regressors);
        c.last_pred_reg = 0;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }
  else  // this is an example where we can only perform a subset of the actions
  {
    // in this case generate cost-sensitive example with only allowed actions
    for (auto& cl : ld.costs)
    {
      COST_SENSITIVE::wclass wc = {0., cl.action, 0., 0.};
      if (c.known_cost != nullptr && cl.action == c.known_cost->action)
      {
        wc.x = c.known_cost->cost /
            safe_probability(
                c.known_cost->probability);  // use importance weighted cost for observed action, 0 otherwise

        // ips can be thought as the doubly robust method with a fixed regressor that predicts 0 costs for everything
        // update the loss of this regressor
        c.nb_ex_regressors++;
        c.avg_loss_regressors +=
            (1.0f / c.nb_ex_regressors) * ((c.known_cost->cost) * (c.known_cost->cost) - c.avg_loss_regressors);
        c.last_pred_reg = 0;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }
}